

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase125::~TestCase125(TestCase125 *this)

{
  TestCase125 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(DynamicApi, AnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initDynamicTestMessage(
      root.getAnyPointerField().initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.getAnyPointerField().initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(root.asReader().getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(root.getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
  }

  // Setting an AnyPointer to various types should work.
  toDynamic(root).set("anyPointerField", capnp::Text::Reader("foo"));
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());

  {
    auto orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    toDynamic(root).set("anyPointerField", orphan.getReader());
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());

    toDynamic(root).adopt("anyPointerField", kj::mv(orphan));
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  }

  {
    auto lorphan = builder.getOrphanage().newOrphan<List<uint32_t>>(3);
    lorphan.get().set(0, 12);
    lorphan.get().set(1, 34);
    lorphan.get().set(2, 56);
    toDynamic(root).set("anyPointerField", lorphan.getReader());
    auto l = root.getAnyPointerField().getAs<List<uint32_t>>();
    ASSERT_EQ(3, l.size());
    EXPECT_EQ(12, l[0]);
    EXPECT_EQ(34, l[1]);
    EXPECT_EQ(56, l[2]);
  }

  // Just compile this one.
  toDynamic(root).set("anyPointerField", Capability::Client(nullptr));
  root.getAnyPointerField().getAs<Capability>();
}